

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::AcesInputFile::AcesInputFile(AcesInputFile *this,IStream *is,int numThreads)

{
  Data *pDVar1;
  RgbaInputFile *this_00;
  
  this->_vptr_AcesInputFile = (_func_int **)&PTR__AcesInputFile_0049db38;
  pDVar1 = (Data *)operator_new(0x70);
  Data::Data(pDVar1);
  this->_data = pDVar1;
  this_00 = (RgbaInputFile *)operator_new(0x38);
  RgbaInputFile::RgbaInputFile(this_00,is,numThreads);
  pDVar1 = this->_data;
  pDVar1->rgbaFile = this_00;
  Data::initColorConversion(pDVar1);
  return;
}

Assistant:

AcesInputFile::AcesInputFile (IStream &is, int numThreads):
    _data (new Data)
{
    _data->rgbaFile = new RgbaInputFile (is, numThreads);
    _data->initColorConversion();
}